

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Read<int> __thiscall Omega_h::array_cast<int,signed_char>(Omega_h *this,Read<signed_char> *in)

{
  int *piVar1;
  Alloc *pAVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  LO LVar6;
  Read<int> RVar7;
  type f;
  Write<int> out;
  string local_68;
  Write<int> local_48;
  Write<int> local_30;
  
  pAVar2 = (in->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    LVar6 = (LO)pAVar2->size;
  }
  else {
    LVar6 = (LO)((ulong)pAVar2 >> 3);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  Write<int>::Write(&local_48,LVar6,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)local_48.shared_alloc_.alloc;
  if (((ulong)local_48.shared_alloc_.alloc & 7) == 0 && local_48.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_68._M_dataplus._M_p = (pointer)((local_48.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.shared_alloc_.alloc)->use_count = (local_48.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68._M_string_length = (size_type)local_48.shared_alloc_.direct_ptr;
  pAVar2 = (in->write_).shared_alloc_.alloc;
  local_68.field_2._M_allocated_capacity = (size_type)pAVar2;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68.field_2._M_allocated_capacity = (size_type)(Alloc *)(pAVar2->size * 8 + 1);
    }
    else {
      pAVar2->use_count = pAVar2->use_count + 1;
    }
  }
  local_68.field_2._8_8_ = (in->write_).shared_alloc_.direct_ptr;
  if (((ulong)pAVar2 & 1) == 0) {
    LVar6 = (LO)pAVar2->size;
  }
  else {
    LVar6 = (LO)((ulong)pAVar2 >> 3);
  }
  parallel_for<Omega_h::array_cast<int,signed_char>(Omega_h::Read<signed_char>)::_lambda(int)_1_>
            (LVar6,(type *)&local_68,"array_cast");
  local_30.shared_alloc_.alloc = local_48.shared_alloc_.alloc;
  local_30.shared_alloc_.direct_ptr = local_48.shared_alloc_.direct_ptr;
  if ((((ulong)local_48.shared_alloc_.alloc & 7) == 0 &&
       local_48.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_48.shared_alloc_.alloc)->use_count = (local_48.shared_alloc_.alloc)->use_count + -1;
    local_30.shared_alloc_.alloc = (Alloc *)((local_48.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_48.shared_alloc_.alloc = (Alloc *)0x0;
  local_48.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,&local_30);
  pAVar2 = local_30.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_30.shared_alloc_.alloc & 7) == 0 && local_30.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_30.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  uVar4 = local_68.field_2._M_allocated_capacity;
  if ((local_68.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_68.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar1 = (int *)(local_68.field_2._M_allocated_capacity + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_68.field_2._M_allocated_capacity);
      operator_delete((void *)uVar4,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  _Var3._M_p = local_68._M_dataplus._M_p;
  if (((ulong)local_68._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_68._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_68._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_68._M_dataplus._M_p);
      operator_delete(_Var3._M_p,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  pAVar2 = local_48.shared_alloc_.alloc;
  if (((ulong)local_48.shared_alloc_.alloc & 7) == 0 && local_48.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_48.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_03;
    }
  }
  RVar7.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar7.write_.shared_alloc_;
}

Assistant:

Read<Tout> array_cast(Read<Tin> in) {
  auto out = Write<Tout>(in.size());
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = static_cast<Tout>(in[i]); };
  parallel_for(in.size(), f, "array_cast");
  return out;
}